

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_evalfile(t_symbol *name,t_symbol *dir)

{
  char *pcVar1;
  _class **pp_Var2;
  _class **pp_Var3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  t_symbol *ptVar9;
  _binbuf *p_Var10;
  bool bVar11;
  _binbuf *newb;
  t_pd *boundn;
  t_pd *bounda;
  int dspstate;
  int import;
  _binbuf *b;
  t_symbol *dir_local;
  t_symbol *name_local;
  
  _dspstate = binbuf_new();
  pcVar1 = name->s_name;
  sVar6 = strlen(name->s_name);
  iVar4 = strcmp(pcVar1 + (sVar6 - 4),".pat");
  bVar11 = true;
  if (iVar4 != 0) {
    pcVar1 = name->s_name;
    sVar6 = strlen(name->s_name);
    iVar4 = strcmp(pcVar1 + (sVar6 - 4),".mxt");
    bVar11 = iVar4 == 0;
  }
  iVar4 = canvas_suspend_dsp();
  glob_setfilename((void *)0x0,name,dir);
  iVar5 = binbuf_read(_dspstate,name->s_name,dir->s_name,0);
  if (iVar5 == 0) {
    ptVar9 = gensym("#A");
    pp_Var3 = s__N.s_thing;
    pp_Var2 = ptVar9->s_thing;
    ptVar9 = gensym("#A");
    ptVar9->s_thing = (_class **)0x0;
    s__N.s_thing = &pd_canvasmaker;
    if (bVar11) {
      p_Var10 = binbuf_convert(_dspstate,1);
      binbuf_free(_dspstate);
      _dspstate = p_Var10;
    }
    binbuf_eval(_dspstate,(t_pd *)0x0,0,(t_atom *)0x0);
    if ((s__X.s_thing != (_class **)0x0) && (*s__X.s_thing == canvas_class)) {
      canvas_initbang((_glist *)s__X.s_thing);
    }
    ptVar9 = gensym("#A");
    ptVar9->s_thing = pp_Var2;
    s__N.s_thing = pp_Var3;
  }
  else {
    pcVar1 = name->s_name;
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    pd_error((void *)0x0,"%s: read failed; %s",pcVar1,pcVar8);
  }
  glob_setfilename((void *)0x0,&s_,&s_);
  binbuf_free(_dspstate);
  canvas_resume_dsp(iVar4);
  return;
}

Assistant:

void binbuf_evalfile(t_symbol *name, t_symbol *dir)
{
    t_binbuf *b = binbuf_new();
    int import = !strcmp(name->s_name + strlen(name->s_name) - 4, ".pat") ||
        !strcmp(name->s_name + strlen(name->s_name) - 4, ".mxt");
    int dspstate = canvas_suspend_dsp();
        /* set filename so that new canvases can pick them up */
    glob_setfilename(0, name, dir);
    if (binbuf_read(b, name->s_name, dir->s_name, 0))
        pd_error(0, "%s: read failed; %s", name->s_name, strerror(errno));
    else
    {
            /* save bindings of symbols #N, #A (and restore afterward) */
        t_pd *bounda = gensym("#A")->s_thing, *boundn = s__N.s_thing;
        gensym("#A")->s_thing = 0;
        s__N.s_thing = &pd_canvasmaker;
        if (import)
        {
            t_binbuf *newb = binbuf_convert(b, 1);
            binbuf_free(b);
            b = newb;
        }
        binbuf_eval(b, 0, 0, 0);
            /* avoid crashing if no canvas was created by binbuf eval */
        if (s__X.s_thing && *s__X.s_thing == canvas_class)
            canvas_initbang((t_canvas *)(s__X.s_thing)); /* JMZ*/
        gensym("#A")->s_thing = bounda;
        s__N.s_thing = boundn;
    }
    glob_setfilename(0, &s_, &s_);
    binbuf_free(b);
    canvas_resume_dsp(dspstate);
}